

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlibrary.cpp
# Opt level: O3

void QLibrary::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined4 uVar4;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == WriteProperty) {
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setLoadHints((QLibrary *)_o,
                     (QFlagsStorageHelper<QLibrary::LoadHint,_4>)
                     *(QFlagsStorageHelper<QLibrary::LoadHint,_4> *)&(((QString *)*_a)->d).d);
        return;
      }
      goto LAB_00494b63;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFileName((QLibrary *)_o,(QString *)*_a);
        return;
      }
      goto LAB_00494b63;
    }
  }
  else if (_c == ReadProperty) {
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      uVar4 = 0;
      if ((_func_int **)0x7 < _o[1]._vptr_QObject) {
        uVar4 = *(undefined4 *)(((ulong)_o[1]._vptr_QObject & 0xfffffffffffffff8) + 0xa0);
      }
      *(undefined4 *)puVar1 = uVar4;
    }
    else if (_id == 0) {
      fileName(&local_38,(QLibrary *)_o);
      data = (QArrayData *)*puVar1;
      pcVar2 = (char16_t *)puVar1[1];
      *puVar1 = local_38.d.d;
      puVar1[1] = local_38.d.ptr;
      qVar3 = puVar1[2];
      puVar1[2] = local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = pcVar2;
      local_38.d.size = qVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00494b63:
  __stack_chk_fail();
}

Assistant:

void QLibrary::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLibrary *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->fileName(); break;
        case 1: QtMocHelpers::assignFlags<LoadHints>(_v, _t->loadHints()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFileName(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setLoadHints(*reinterpret_cast<LoadHints*>(_v)); break;
        default: break;
        }
    }
}